

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_panel.cxx
# Opt level: O0

Fl_Double_Window * make_function_panel(void)

{
  Fl_Double_Window *this;
  Fl_Group *pFVar1;
  Fl_Widget *pFVar2;
  Fl_Group *pFVar3;
  Fl_Text_Editor *pFVar4;
  Fl_Text_Buffer *this_00;
  Fl_Window *this_01;
  Fl_Button *this_02;
  Fl_Box *o_3;
  Fl_Group *o_2;
  Fl_Box *o_1;
  Fl_Group *o;
  
  this = (Fl_Double_Window *)operator_new(0xf0);
  Fl_Double_Window::Fl_Double_Window(this,0x157,0xe8,"Function/Method Properties");
  function_panel = this;
  pFVar1 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar1,10,10,0x10e,0x14,(char *)0x0);
  pFVar2 = (Fl_Widget *)operator_new(0x98);
  Fl_Choice::Fl_Choice((Fl_Choice *)pFVar2,10,10,0x4b,0x14,(char *)0x0);
  f_public_member_choice = (Fl_Choice *)pFVar2;
  Fl_Widget::tooltip(pFVar2,"Change member access attribute.");
  Fl_Menu_::down_box(&f_public_member_choice->super_Fl_Menu_,FL_BORDER_BOX);
  Fl_Widget::labelsize((Fl_Widget *)f_public_member_choice,0xb);
  Fl_Menu_::textsize(&f_public_member_choice->super_Fl_Menu_,0xb);
  Fl_Widget::when((Fl_Widget *)f_public_member_choice,'\x01');
  Fl_Menu_::menu(&f_public_member_choice->super_Fl_Menu_,menu_f_public_member_choice);
  pFVar2 = (Fl_Widget *)operator_new(0x98);
  Fl_Choice::Fl_Choice((Fl_Choice *)pFVar2,10,10,0x4b,0x14,(char *)0x0);
  f_public_choice = (Fl_Choice *)pFVar2;
  Fl_Widget::tooltip(pFVar2,"Change widget accessibility.");
  Fl_Menu_::down_box(&f_public_choice->super_Fl_Menu_,FL_BORDER_BOX);
  Fl_Widget::labelsize((Fl_Widget *)f_public_choice,0xb);
  Fl_Menu_::textsize(&f_public_choice->super_Fl_Menu_,0xb);
  Fl_Widget::when((Fl_Widget *)f_public_choice,'\x01');
  Fl_Menu_::menu(&f_public_choice->super_Fl_Menu_,menu_f_public_choice);
  pFVar2 = (Fl_Widget *)operator_new(0x80);
  Fl_Light_Button::Fl_Light_Button((Fl_Light_Button *)pFVar2,0x5f,10,0x78,0x14,"C declaration");
  f_c_button = (Fl_Light_Button *)pFVar2;
  Fl_Widget::tooltip(pFVar2,"Declare with a C interface instead of C++.");
  Fl_Widget::labelsize((Fl_Widget *)f_c_button,0xb);
  pFVar2 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar2,0xeb,10,0x2d,0x14,(char *)0x0);
  pFVar3 = Fl_Group::current();
  Fl_Group::resizable(pFVar3,pFVar2);
  Fl_Group::end(pFVar1);
  pFVar2 = (Fl_Widget *)operator_new(200);
  Fl_Input::Fl_Input((Fl_Input *)pFVar2,10,0x32,0x140,0x14,"Name(args): (blank for main())");
  f_name_input = (Fl_Input *)pFVar2;
  Fl_Widget::tooltip(pFVar2,"The name of the function or method.");
  Fl_Widget::labelfont((Fl_Widget *)f_name_input,1);
  Fl_Widget::labelsize((Fl_Widget *)f_name_input,0xb);
  Fl_Input_::textfont(&f_name_input->super_Fl_Input_,4);
  Fl_Input_::textsize(&f_name_input->super_Fl_Input_,0xb);
  Fl_Widget::align((Fl_Widget *)f_name_input,5);
  Fl_Widget::when((Fl_Widget *)f_name_input,'\0');
  pFVar2 = (Fl_Widget *)operator_new(200);
  Fl_Input::Fl_Input((Fl_Input *)pFVar2,10,0x5a,0x140,0x14,
                     "Return Type: (blank to return outermost widget)");
  f_return_type_input = (Fl_Input *)pFVar2;
  Fl_Widget::tooltip(pFVar2,"The return type of the function or method.");
  Fl_Widget::labelfont((Fl_Widget *)f_return_type_input,1);
  Fl_Widget::labelsize((Fl_Widget *)f_return_type_input,0xb);
  Fl_Input_::textfont(&f_return_type_input->super_Fl_Input_,4);
  Fl_Input_::textsize(&f_return_type_input->super_Fl_Input_,0xb);
  Fl_Widget::align((Fl_Widget *)f_return_type_input,5);
  Fl_Widget::when((Fl_Widget *)f_return_type_input,'\0');
  pFVar4 = (Fl_Text_Editor *)operator_new(0x1c0);
  Fl_Text_Editor::Fl_Text_Editor(pFVar4,10,0x7d,0x140,0x41,"Comment:");
  f_comment_input = pFVar4;
  Fl_Widget::tooltip((Fl_Widget *)pFVar4,"Function comment in Doxygen format");
  Fl_Widget::box((Fl_Widget *)f_comment_input,FL_DOWN_BOX);
  Fl_Widget::labelfont((Fl_Widget *)f_comment_input,1);
  Fl_Widget::labelsize((Fl_Widget *)f_comment_input,0xb);
  Fl_Text_Display::textfont(&f_comment_input->super_Fl_Text_Display,4);
  Fl_Text_Display::textsize(&f_comment_input->super_Fl_Text_Display,0xb);
  Fl_Widget::align((Fl_Widget *)f_comment_input,5);
  pFVar1 = Fl_Group::current();
  Fl_Group::resizable(pFVar1,(Fl_Widget *)f_comment_input);
  pFVar4 = f_comment_input;
  this_00 = (Fl_Text_Buffer *)operator_new(0x88);
  Fl_Text_Buffer::Fl_Text_Buffer(this_00,0,0x400);
  Fl_Text_Display::buffer(&pFVar4->super_Fl_Text_Display,this_00);
  Fl_Text_Editor::add_key_binding(f_comment_input,0xff09,0,use_tab_navigation);
  pFVar1 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar1,10,200,0x140,0x14,(char *)0x0);
  pFVar2 = (Fl_Widget *)operator_new(0x80);
  Fl_Return_Button::Fl_Return_Button((Fl_Return_Button *)pFVar2,0xdc,200,0x32,0x14,"OK");
  f_panel_ok = (Fl_Return_Button *)pFVar2;
  Fl_Widget::tooltip(pFVar2,"Apply the changes.");
  Fl_Widget::labelsize((Fl_Widget *)f_panel_ok,0xb);
  this_01 = Fl_Widget::window((Fl_Widget *)f_panel_ok);
  Fl_Window::hotspot(this_01,(Fl_Widget *)f_panel_ok,0);
  this_02 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(this_02,0x118,200,0x32,0x14,"Cancel");
  f_panel_cancel = this_02;
  Fl_Widget::tooltip((Fl_Widget *)this_02,"Cancel the changes.");
  Fl_Widget::labelsize(&f_panel_cancel->super_Fl_Widget,0xb);
  pFVar2 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar2,10,200,0xcd,0x14,(char *)0x0);
  pFVar3 = Fl_Group::current();
  Fl_Group::resizable(pFVar3,pFVar2);
  Fl_Group::end(pFVar1);
  Fl_Window::set_modal(&function_panel->super_Fl_Window);
  Fl_Group::end((Fl_Group *)function_panel);
  return function_panel;
}

Assistant:

Fl_Double_Window* make_function_panel() {
  { function_panel = new Fl_Double_Window(343, 232, "Function/Method Properties");
    { Fl_Group* o = new Fl_Group(10, 10, 270, 20);
      { f_public_member_choice = new Fl_Choice(10, 10, 75, 20);
        f_public_member_choice->tooltip("Change member access attribute.");
        f_public_member_choice->down_box(FL_BORDER_BOX);
        f_public_member_choice->labelsize(11);
        f_public_member_choice->textsize(11);
        f_public_member_choice->when(FL_WHEN_CHANGED);
        f_public_member_choice->menu(menu_f_public_member_choice);
      } // Fl_Choice* f_public_member_choice
      { f_public_choice = new Fl_Choice(10, 10, 75, 20);
        f_public_choice->tooltip("Change widget accessibility.");
        f_public_choice->down_box(FL_BORDER_BOX);
        f_public_choice->labelsize(11);
        f_public_choice->textsize(11);
        f_public_choice->when(FL_WHEN_CHANGED);
        f_public_choice->menu(menu_f_public_choice);
      } // Fl_Choice* f_public_choice
      { f_c_button = new Fl_Light_Button(95, 10, 120, 20, "C declaration");
        f_c_button->tooltip("Declare with a C interface instead of C++.");
        f_c_button->labelsize(11);
      } // Fl_Light_Button* f_c_button
      { Fl_Box* o = new Fl_Box(235, 10, 45, 20);
        Fl_Group::current()->resizable(o);
      } // Fl_Box* o
      o->end();
    } // Fl_Group* o
    { f_name_input = new Fl_Input(10, 50, 320, 20, "Name(args): (blank for main())");
      f_name_input->tooltip("The name of the function or method.");
      f_name_input->labelfont(1);
      f_name_input->labelsize(11);
      f_name_input->textfont(4);
      f_name_input->textsize(11);
      f_name_input->align(Fl_Align(FL_ALIGN_TOP_LEFT));
      f_name_input->when(FL_WHEN_NEVER);
    } // Fl_Input* f_name_input
    { f_return_type_input = new Fl_Input(10, 90, 320, 20, "Return Type: (blank to return outermost widget)");
      f_return_type_input->tooltip("The return type of the function or method.");
      f_return_type_input->labelfont(1);
      f_return_type_input->labelsize(11);
      f_return_type_input->textfont(4);
      f_return_type_input->textsize(11);
      f_return_type_input->align(Fl_Align(FL_ALIGN_TOP_LEFT));
      f_return_type_input->when(FL_WHEN_NEVER);
    } // Fl_Input* f_return_type_input
    { f_comment_input = new Fl_Text_Editor(10, 125, 320, 65, "Comment:");
      f_comment_input->tooltip("Function comment in Doxygen format");
      f_comment_input->box(FL_DOWN_BOX);
      f_comment_input->labelfont(1);
      f_comment_input->labelsize(11);
      f_comment_input->textfont(4);
      f_comment_input->textsize(11);
      f_comment_input->align(Fl_Align(FL_ALIGN_TOP_LEFT));
      Fl_Group::current()->resizable(f_comment_input);
      f_comment_input->buffer(new Fl_Text_Buffer());
      f_comment_input->add_key_binding(FL_Tab, 0, use_tab_navigation);
    } // Fl_Text_Editor* f_comment_input
    { Fl_Group* o = new Fl_Group(10, 200, 320, 20);
      { f_panel_ok = new Fl_Return_Button(220, 200, 50, 20, "OK");
        f_panel_ok->tooltip("Apply the changes.");
        f_panel_ok->labelsize(11);
        f_panel_ok->window()->hotspot(f_panel_ok);
      } // Fl_Return_Button* f_panel_ok
      { f_panel_cancel = new Fl_Button(280, 200, 50, 20, "Cancel");
        f_panel_cancel->tooltip("Cancel the changes.");
        f_panel_cancel->labelsize(11);
      } // Fl_Button* f_panel_cancel
      { Fl_Box* o = new Fl_Box(10, 200, 205, 20);
        Fl_Group::current()->resizable(o);
      } // Fl_Box* o
      o->end();
    } // Fl_Group* o
    function_panel->set_modal();
    function_panel->end();
  } // Fl_Double_Window* function_panel
  return function_panel;
}